

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B2A_adapter.h
# Opt level: O2

void __thiscall adapter::B2AAdapter::~B2AAdapter(B2AAdapter *this)

{
  (this->super_ASocket)._vptr_ASocket = (_func_int **)&PTR_charge_001367d0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->pbplug_).super___shared_ptr<adapter::BPlug,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ASocket::~ASocket(&this->super_ASocket);
  return;
}

Assistant:

B2AAdapter::~B2AAdapter() {}